

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_striped_sse41_128_16.c
# Opt level: O1

parasail_result_t *
parasail_nw_rowcol_striped_profile_sse41_128_16
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  ushort *puVar1;
  short *psVar2;
  void *pvVar3;
  parasail_matrix_t *ppVar4;
  int *piVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  undefined1 auVar12 [16];
  uint uVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  parasail_result_t *ppVar17;
  __m128i *ptr;
  __m128i *palVar18;
  __m128i *ptr_00;
  int16_t *ptr_01;
  int iVar19;
  int iVar20;
  int iVar21;
  int16_t iVar22;
  int iVar23;
  long lVar24;
  long lVar25;
  ulong uVar26;
  long lVar27;
  ulong uVar28;
  ulong uVar29;
  undefined2 uVar30;
  uint uVar31;
  long lVar32;
  int iVar33;
  __m128i *ptr_02;
  int iVar34;
  ulong uVar35;
  bool bVar36;
  undefined4 uVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  short sVar47;
  short sVar48;
  undefined1 auVar49 [16];
  ulong uVar50;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  short sVar55;
  short sVar56;
  short sVar57;
  short sVar58;
  short sVar59;
  undefined1 auVar53 [16];
  short sVar60;
  undefined1 auVar54 [16];
  ushort uVar61;
  ushort uVar64;
  ushort uVar65;
  ushort uVar66;
  ushort uVar67;
  ushort uVar68;
  ushort uVar69;
  ushort uVar71;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  __m128i_16_t e;
  __m128i_16_t h;
  longlong local_58;
  longlong lStack_50;
  longlong local_48;
  longlong lStack_40;
  short sVar37;
  short sVar42;
  short sVar70;
  short sVar72;
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_nw_rowcol_striped_profile_sse41_128_16_cold_8();
  }
  else {
    pvVar3 = (profile->profile16).score;
    if (pvVar3 == (void *)0x0) {
      parasail_nw_rowcol_striped_profile_sse41_128_16_cold_7();
    }
    else {
      ppVar4 = profile->matrix;
      if (ppVar4 == (parasail_matrix_t *)0x0) {
        parasail_nw_rowcol_striped_profile_sse41_128_16_cold_6();
      }
      else {
        uVar31 = profile->s1Len;
        if ((int)uVar31 < 1) {
          parasail_nw_rowcol_striped_profile_sse41_128_16_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_nw_rowcol_striped_profile_sse41_128_16_cold_4();
        }
        else if (s2Len < 1) {
          parasail_nw_rowcol_striped_profile_sse41_128_16_cold_3();
        }
        else if (open < 0) {
          parasail_nw_rowcol_striped_profile_sse41_128_16_cold_2();
        }
        else if (gap < 0) {
          parasail_nw_rowcol_striped_profile_sse41_128_16_cold_1();
        }
        else {
          iVar15 = uVar31 - 1;
          uVar35 = (ulong)uVar31 + 7 >> 3;
          iVar34 = (int)uVar35;
          iVar16 = iVar15 / iVar34;
          iVar33 = -open;
          iVar21 = ppVar4->min;
          iVar23 = -iVar21;
          if (iVar21 != iVar33 && SBORROW4(iVar21,iVar33) == iVar21 + open < 0) {
            iVar23 = open;
          }
          iVar14 = ppVar4->max;
          ppVar17 = parasail_result_new_rowcol1((uint)((ulong)uVar31 + 7) & 0x7ffffff8,s2Len);
          if (ppVar17 != (parasail_result_t *)0x0) {
            ppVar17->flag = ppVar17->flag | 0x8240801;
            ptr = parasail_memalign___m128i(0x10,uVar35);
            palVar18 = parasail_memalign___m128i(0x10,uVar35);
            ptr_00 = parasail_memalign___m128i(0x10,uVar35);
            ptr_01 = parasail_memalign_int16_t(0x10,(ulong)(s2Len + 1));
            if ((ptr_01 != (int16_t *)0x0 && ptr_00 != (__m128i *)0x0) &&
                (palVar18 != (__m128i *)0x0 && ptr != (__m128i *)0x0)) {
              iVar19 = s2Len + -1;
              iVar20 = 7 - iVar16;
              auVar39 = pshuflw(ZEXT416((uint)open),ZEXT416((uint)open),0);
              uVar38 = auVar39._0_4_;
              auVar45._4_4_ = uVar38;
              auVar45._0_4_ = uVar38;
              auVar45._8_4_ = uVar38;
              auVar45._12_4_ = uVar38;
              auVar39 = pshuflw(ZEXT416((uint)gap),ZEXT416((uint)gap),0);
              uVar38 = auVar39._0_4_;
              auVar39 = pshuflw(ZEXT416(iVar23 - 0x7fff),ZEXT416(iVar23 - 0x7fff),0);
              auVar40._0_4_ = auVar39._0_4_;
              auVar40._4_4_ = auVar40._0_4_;
              auVar40._8_4_ = auVar40._0_4_;
              auVar40._12_4_ = auVar40._0_4_;
              auVar43 = ZEXT416(CONCAT22((short)((uint)iVar21 >> 0x10),0x7ffe - (short)iVar14));
              auVar43 = pshuflw(auVar43,auVar43,0);
              auVar44._0_4_ = auVar43._0_4_;
              auVar44._4_4_ = auVar44._0_4_;
              auVar44._8_4_ = auVar44._0_4_;
              auVar44._12_4_ = auVar44._0_4_;
              lVar25 = (long)iVar33;
              uVar28 = 0;
              do {
                lVar24 = 0;
                lVar27 = lVar25;
                do {
                  uVar30 = 0x8000;
                  if (-0x8000 < lVar27) {
                    uVar30 = (undefined2)lVar27;
                  }
                  *(undefined2 *)((long)&local_48 + lVar24 * 2) = uVar30;
                  lVar32 = lVar27 - (ulong)(uint)open;
                  if (lVar32 < -0x7fff) {
                    lVar32 = -0x8000;
                  }
                  *(short *)((long)&local_58 + lVar24 * 2) = (short)lVar32;
                  lVar24 = lVar24 + 1;
                  lVar27 = lVar27 - uVar35 * (uint)gap;
                } while (lVar24 != 8);
                ptr[uVar28][0] = local_48;
                ptr[uVar28][1] = lStack_40;
                ptr_00[uVar28][0] = local_58;
                ptr_00[uVar28][1] = lStack_50;
                uVar28 = uVar28 + 1;
                lVar25 = lVar25 - (ulong)(uint)gap;
              } while (uVar28 != uVar35);
              *ptr_01 = 0;
              uVar28 = 1;
              do {
                iVar22 = -0x8000;
                if (-0x8000 < iVar33) {
                  iVar22 = (int16_t)iVar33;
                }
                ptr_01[uVar28] = iVar22;
                uVar28 = uVar28 + 1;
                iVar33 = iVar33 - gap;
              } while (s2Len + 1 != uVar28);
              iVar21 = 1;
              if (1 < iVar20) {
                iVar21 = iVar20;
              }
              uVar28 = 1;
              if (1 < s2Len) {
                uVar28 = (ulong)(uint)s2Len;
              }
              lVar25 = (ulong)(iVar34 + (uint)(iVar34 == 0)) << 4;
              uVar26 = 0;
              auVar51 = auVar40;
              do {
                ptr_02 = ptr;
                ptr = palVar18;
                uVar29 = ptr_02[iVar34 - 1][0];
                iVar23 = ppVar4->mapper[(byte)s2[uVar26]];
                auVar53._8_8_ = ptr_02[iVar34 - 1][1] << 0x10 | uVar29 >> 0x30;
                auVar53._0_8_ = uVar29 << 0x10 | (ulong)(ushort)ptr_01[uVar26];
                lVar27 = 0;
                auVar46 = auVar51;
                auVar49 = auVar40;
                do {
                  auVar51 = paddsw(auVar53,*(undefined1 (*) [16])
                                            ((long)pvVar3 + lVar27 + uVar35 * (long)iVar23 * 0x10));
                  auVar53 = *(undefined1 (*) [16])((long)*ptr_00 + lVar27);
                  sVar37 = auVar49._0_2_;
                  sVar55 = auVar53._0_2_;
                  uVar61 = (ushort)(sVar55 < sVar37) * sVar37 | (ushort)(sVar55 >= sVar37) * sVar55;
                  sVar6 = auVar49._2_2_;
                  sVar56 = auVar53._2_2_;
                  uVar64 = (ushort)(sVar56 < sVar6) * sVar6 | (ushort)(sVar56 >= sVar6) * sVar56;
                  sVar7 = auVar49._4_2_;
                  sVar57 = auVar53._4_2_;
                  uVar65 = (ushort)(sVar57 < sVar7) * sVar7 | (ushort)(sVar57 >= sVar7) * sVar57;
                  sVar8 = auVar49._6_2_;
                  sVar58 = auVar53._6_2_;
                  uVar66 = (ushort)(sVar58 < sVar8) * sVar8 | (ushort)(sVar58 >= sVar8) * sVar58;
                  sVar9 = auVar49._8_2_;
                  sVar59 = auVar53._8_2_;
                  uVar67 = (ushort)(sVar59 < sVar9) * sVar9 | (ushort)(sVar59 >= sVar9) * sVar59;
                  sVar10 = auVar49._10_2_;
                  sVar60 = auVar53._10_2_;
                  uVar68 = (ushort)(sVar60 < sVar10) * sVar10 | (ushort)(sVar60 >= sVar10) * sVar60;
                  sVar11 = auVar49._12_2_;
                  sVar70 = auVar53._12_2_;
                  sVar72 = auVar53._14_2_;
                  uVar69 = (ushort)(sVar70 < sVar11) * sVar11 | (ushort)(sVar70 >= sVar11) * sVar70;
                  sVar48 = auVar49._14_2_;
                  uVar71 = (ushort)(sVar72 < sVar48) * sVar48 | (ushort)(sVar72 >= sVar48) * sVar72;
                  sVar42 = auVar51._0_2_;
                  auVar62._0_2_ =
                       (ushort)((short)uVar61 < sVar42) * sVar42 |
                       ((short)uVar61 >= sVar42) * uVar61;
                  sVar42 = auVar51._2_2_;
                  auVar62._2_2_ =
                       (ushort)((short)uVar64 < sVar42) * sVar42 |
                       ((short)uVar64 >= sVar42) * uVar64;
                  sVar42 = auVar51._4_2_;
                  auVar62._4_2_ =
                       (ushort)((short)uVar65 < sVar42) * sVar42 |
                       ((short)uVar65 >= sVar42) * uVar65;
                  sVar42 = auVar51._6_2_;
                  auVar62._6_2_ =
                       (ushort)((short)uVar66 < sVar42) * sVar42 |
                       ((short)uVar66 >= sVar42) * uVar66;
                  sVar42 = auVar51._8_2_;
                  auVar62._8_2_ =
                       (ushort)((short)uVar67 < sVar42) * sVar42 |
                       ((short)uVar67 >= sVar42) * uVar67;
                  sVar42 = auVar51._10_2_;
                  auVar62._10_2_ =
                       (ushort)((short)uVar68 < sVar42) * sVar42 |
                       ((short)uVar68 >= sVar42) * uVar68;
                  sVar42 = auVar51._12_2_;
                  auVar62._12_2_ =
                       (ushort)((short)uVar69 < sVar42) * sVar42 |
                       ((short)uVar69 >= sVar42) * uVar69;
                  sVar42 = auVar51._14_2_;
                  auVar62._14_2_ =
                       (ushort)((short)uVar71 < sVar42) * sVar42 |
                       ((short)uVar71 >= sVar42) * uVar71;
                  *(undefined1 (*) [16])((long)*ptr + lVar27) = auVar62;
                  sVar42 = auVar46._0_2_;
                  auVar51._0_2_ =
                       (sVar42 < (short)auVar62._0_2_) * auVar62._0_2_ |
                       (ushort)(sVar42 >= (short)auVar62._0_2_) * sVar42;
                  sVar42 = auVar46._2_2_;
                  auVar51._2_2_ =
                       (sVar42 < (short)auVar62._2_2_) * auVar62._2_2_ |
                       (ushort)(sVar42 >= (short)auVar62._2_2_) * sVar42;
                  sVar42 = auVar46._4_2_;
                  auVar51._4_2_ =
                       (sVar42 < (short)auVar62._4_2_) * auVar62._4_2_ |
                       (ushort)(sVar42 >= (short)auVar62._4_2_) * sVar42;
                  sVar42 = auVar46._6_2_;
                  auVar51._6_2_ =
                       (sVar42 < (short)auVar62._6_2_) * auVar62._6_2_ |
                       (ushort)(sVar42 >= (short)auVar62._6_2_) * sVar42;
                  sVar42 = auVar46._8_2_;
                  auVar51._8_2_ =
                       (sVar42 < (short)auVar62._8_2_) * auVar62._8_2_ |
                       (ushort)(sVar42 >= (short)auVar62._8_2_) * sVar42;
                  sVar42 = auVar46._10_2_;
                  auVar51._10_2_ =
                       (sVar42 < (short)auVar62._10_2_) * auVar62._10_2_ |
                       (ushort)(sVar42 >= (short)auVar62._10_2_) * sVar42;
                  sVar42 = auVar46._12_2_;
                  sVar47 = auVar46._14_2_;
                  auVar51._12_2_ =
                       (sVar42 < (short)auVar62._12_2_) * auVar62._12_2_ |
                       (ushort)(sVar42 >= (short)auVar62._12_2_) * sVar42;
                  auVar51._14_2_ =
                       (sVar47 < (short)auVar62._14_2_) * auVar62._14_2_ |
                       (ushort)(sVar47 >= (short)auVar62._14_2_) * sVar47;
                  sVar42 = auVar44._0_2_;
                  uVar61 = (ushort)(sVar55 < sVar42) * sVar55 | (ushort)(sVar55 >= sVar42) * sVar42;
                  sVar42 = auVar44._2_2_;
                  uVar64 = (ushort)(sVar56 < sVar42) * sVar56 | (ushort)(sVar56 >= sVar42) * sVar42;
                  sVar42 = auVar44._4_2_;
                  uVar65 = (ushort)(sVar57 < sVar42) * sVar57 | (ushort)(sVar57 >= sVar42) * sVar42;
                  sVar42 = auVar44._6_2_;
                  uVar66 = (ushort)(sVar58 < sVar42) * sVar58 | (ushort)(sVar58 >= sVar42) * sVar42;
                  sVar42 = auVar44._8_2_;
                  uVar67 = (ushort)(sVar59 < sVar42) * sVar59 | (ushort)(sVar59 >= sVar42) * sVar42;
                  sVar42 = auVar44._10_2_;
                  uVar68 = (ushort)(sVar60 < sVar42) * sVar60 | (ushort)(sVar60 >= sVar42) * sVar42;
                  sVar42 = auVar44._12_2_;
                  sVar47 = auVar44._14_2_;
                  uVar69 = (ushort)(sVar70 < sVar42) * sVar70 | (ushort)(sVar70 >= sVar42) * sVar42;
                  uVar71 = (ushort)(sVar72 < sVar47) * sVar72 | (ushort)(sVar72 >= sVar47) * sVar47;
                  uVar61 = (ushort)(sVar37 < (short)uVar61) * sVar37 |
                           (sVar37 >= (short)uVar61) * uVar61;
                  uVar64 = (ushort)(sVar6 < (short)uVar64) * sVar6 |
                           (sVar6 >= (short)uVar64) * uVar64;
                  uVar65 = (ushort)(sVar7 < (short)uVar65) * sVar7 |
                           (sVar7 >= (short)uVar65) * uVar65;
                  uVar66 = (ushort)(sVar8 < (short)uVar66) * sVar8 |
                           (sVar8 >= (short)uVar66) * uVar66;
                  uVar67 = (ushort)(sVar9 < (short)uVar67) * sVar9 |
                           (sVar9 >= (short)uVar67) * uVar67;
                  uVar68 = (ushort)(sVar10 < (short)uVar68) * sVar10 |
                           (sVar10 >= (short)uVar68) * uVar68;
                  uVar69 = (ushort)(sVar11 < (short)uVar69) * sVar11 |
                           (sVar11 >= (short)uVar69) * uVar69;
                  uVar71 = (ushort)(sVar48 < (short)uVar71) * sVar48 |
                           (sVar48 >= (short)uVar71) * uVar71;
                  auVar44._0_2_ =
                       ((short)auVar62._0_2_ < (short)uVar61) * auVar62._0_2_ |
                       ((short)auVar62._0_2_ >= (short)uVar61) * uVar61;
                  auVar44._2_2_ =
                       ((short)auVar62._2_2_ < (short)uVar64) * auVar62._2_2_ |
                       ((short)auVar62._2_2_ >= (short)uVar64) * uVar64;
                  auVar44._4_2_ =
                       ((short)auVar62._4_2_ < (short)uVar65) * auVar62._4_2_ |
                       ((short)auVar62._4_2_ >= (short)uVar65) * uVar65;
                  auVar44._6_2_ =
                       ((short)auVar62._6_2_ < (short)uVar66) * auVar62._6_2_ |
                       ((short)auVar62._6_2_ >= (short)uVar66) * uVar66;
                  auVar44._8_2_ =
                       ((short)auVar62._8_2_ < (short)uVar67) * auVar62._8_2_ |
                       ((short)auVar62._8_2_ >= (short)uVar67) * uVar67;
                  auVar44._10_2_ =
                       ((short)auVar62._10_2_ < (short)uVar68) * auVar62._10_2_ |
                       ((short)auVar62._10_2_ >= (short)uVar68) * uVar68;
                  auVar44._12_2_ =
                       ((short)auVar62._12_2_ < (short)uVar69) * auVar62._12_2_ |
                       ((short)auVar62._12_2_ >= (short)uVar69) * uVar69;
                  auVar44._14_2_ =
                       ((short)auVar62._14_2_ < (short)uVar71) * auVar62._14_2_ |
                       ((short)auVar62._14_2_ >= (short)uVar71) * uVar71;
                  auVar63 = psubsw(auVar62,auVar45);
                  auVar46._4_4_ = uVar38;
                  auVar46._0_4_ = uVar38;
                  auVar46._8_4_ = uVar38;
                  auVar46._12_4_ = uVar38;
                  auVar53 = psubsw(auVar53,auVar46);
                  sVar37 = auVar63._0_2_;
                  sVar48 = auVar53._0_2_;
                  sVar42 = auVar63._2_2_;
                  sVar47 = auVar53._2_2_;
                  sVar6 = auVar63._4_2_;
                  sVar55 = auVar53._4_2_;
                  sVar7 = auVar63._6_2_;
                  sVar56 = auVar53._6_2_;
                  sVar8 = auVar63._8_2_;
                  sVar57 = auVar53._8_2_;
                  sVar9 = auVar63._10_2_;
                  sVar58 = auVar53._10_2_;
                  sVar10 = auVar63._12_2_;
                  sVar59 = auVar53._12_2_;
                  sVar60 = auVar53._14_2_;
                  sVar11 = auVar63._14_2_;
                  puVar1 = (ushort *)((long)*ptr_00 + lVar27);
                  *puVar1 = (ushort)(sVar48 < sVar37) * sVar37 | (ushort)(sVar48 >= sVar37) * sVar48
                  ;
                  puVar1[1] = (ushort)(sVar47 < sVar42) * sVar42 |
                              (ushort)(sVar47 >= sVar42) * sVar47;
                  puVar1[2] = (ushort)(sVar55 < sVar6) * sVar6 | (ushort)(sVar55 >= sVar6) * sVar55;
                  puVar1[3] = (ushort)(sVar56 < sVar7) * sVar7 | (ushort)(sVar56 >= sVar7) * sVar56;
                  puVar1[4] = (ushort)(sVar57 < sVar8) * sVar8 | (ushort)(sVar57 >= sVar8) * sVar57;
                  puVar1[5] = (ushort)(sVar58 < sVar9) * sVar9 | (ushort)(sVar58 >= sVar9) * sVar58;
                  puVar1[6] = (ushort)(sVar59 < sVar10) * sVar10 |
                              (ushort)(sVar59 >= sVar10) * sVar59;
                  puVar1[7] = (ushort)(sVar60 < sVar11) * sVar11 |
                              (ushort)(sVar60 >= sVar11) * sVar60;
                  auVar63._4_4_ = uVar38;
                  auVar63._0_4_ = uVar38;
                  auVar63._8_4_ = uVar38;
                  auVar63._12_4_ = uVar38;
                  auVar53 = psubsw(auVar49,auVar63);
                  sVar48 = auVar53._0_2_;
                  auVar49._0_2_ =
                       (ushort)(sVar48 < sVar37) * sVar37 | (ushort)(sVar48 >= sVar37) * sVar48;
                  sVar37 = auVar53._2_2_;
                  auVar49._2_2_ =
                       (ushort)(sVar37 < sVar42) * sVar42 | (ushort)(sVar37 >= sVar42) * sVar37;
                  sVar37 = auVar53._4_2_;
                  auVar49._4_2_ =
                       (ushort)(sVar37 < sVar6) * sVar6 | (ushort)(sVar37 >= sVar6) * sVar37;
                  sVar37 = auVar53._6_2_;
                  auVar49._6_2_ =
                       (ushort)(sVar37 < sVar7) * sVar7 | (ushort)(sVar37 >= sVar7) * sVar37;
                  sVar37 = auVar53._8_2_;
                  auVar49._8_2_ =
                       (ushort)(sVar37 < sVar8) * sVar8 | (ushort)(sVar37 >= sVar8) * sVar37;
                  sVar37 = auVar53._10_2_;
                  auVar49._10_2_ =
                       (ushort)(sVar37 < sVar9) * sVar9 | (ushort)(sVar37 >= sVar9) * sVar37;
                  sVar37 = auVar53._12_2_;
                  sVar42 = auVar53._14_2_;
                  auVar49._12_2_ =
                       (ushort)(sVar37 < sVar10) * sVar10 | (ushort)(sVar37 >= sVar10) * sVar37;
                  auVar49._14_2_ =
                       (ushort)(sVar42 < sVar11) * sVar11 | (ushort)(sVar42 >= sVar11) * sVar42;
                  auVar53 = *(undefined1 (*) [16])((long)*ptr_02 + lVar27);
                  lVar27 = lVar27 + 0x10;
                  auVar46 = auVar51;
                } while (lVar25 != lVar27);
                uVar31 = 0;
                do {
                  uVar13 = ptr_01[uVar26 + 1] - open;
                  if (ptr_01[uVar26 + 1] - open < -0x7fff) {
                    uVar13 = 0xffff8000;
                  }
                  uVar29 = auVar49._0_8_;
                  auVar49._8_8_ = auVar49._8_8_ << 0x10 | uVar29 >> 0x30;
                  auVar49._0_8_ = uVar29 << 0x10 | (ulong)uVar13 & 0xffff;
                  bVar36 = true;
                  uVar29 = 1;
                  lVar27 = 0;
                  auVar53 = auVar51;
                  auVar46 = auVar44;
                  do {
                    psVar2 = (short *)((long)*ptr + lVar27);
                    sVar42 = *psVar2;
                    sVar6 = psVar2[1];
                    sVar7 = psVar2[2];
                    sVar8 = psVar2[3];
                    sVar9 = psVar2[4];
                    sVar10 = psVar2[5];
                    sVar11 = psVar2[6];
                    sVar48 = psVar2[7];
                    sVar37 = auVar49._0_2_;
                    auVar52._0_2_ =
                         (ushort)(sVar42 < sVar37) * sVar37 | (ushort)(sVar42 >= sVar37) * sVar42;
                    sVar37 = auVar49._2_2_;
                    auVar52._2_2_ =
                         (ushort)(sVar6 < sVar37) * sVar37 | (ushort)(sVar6 >= sVar37) * sVar6;
                    sVar37 = auVar49._4_2_;
                    auVar52._4_2_ =
                         (ushort)(sVar7 < sVar37) * sVar37 | (ushort)(sVar7 >= sVar37) * sVar7;
                    sVar37 = auVar49._6_2_;
                    auVar52._6_2_ =
                         (ushort)(sVar8 < sVar37) * sVar37 | (ushort)(sVar8 >= sVar37) * sVar8;
                    sVar37 = auVar49._8_2_;
                    auVar52._8_2_ =
                         (ushort)(sVar9 < sVar37) * sVar37 | (ushort)(sVar9 >= sVar37) * sVar9;
                    sVar37 = auVar49._10_2_;
                    auVar52._10_2_ =
                         (ushort)(sVar10 < sVar37) * sVar37 | (ushort)(sVar10 >= sVar37) * sVar10;
                    sVar37 = auVar49._12_2_;
                    auVar52._12_2_ =
                         (ushort)(sVar11 < sVar37) * sVar37 | (ushort)(sVar11 >= sVar37) * sVar11;
                    sVar37 = auVar49._14_2_;
                    auVar52._14_2_ =
                         (ushort)(sVar48 < sVar37) * sVar37 | (ushort)(sVar48 >= sVar37) * sVar48;
                    *(undefined1 (*) [16])((long)*ptr + lVar27) = auVar52;
                    sVar37 = auVar46._0_2_;
                    auVar44._0_2_ =
                         ((short)auVar52._0_2_ < sVar37) * auVar52._0_2_ |
                         (ushort)((short)auVar52._0_2_ >= sVar37) * sVar37;
                    sVar37 = auVar46._2_2_;
                    auVar44._2_2_ =
                         ((short)auVar52._2_2_ < sVar37) * auVar52._2_2_ |
                         (ushort)((short)auVar52._2_2_ >= sVar37) * sVar37;
                    sVar37 = auVar46._4_2_;
                    auVar44._4_2_ =
                         ((short)auVar52._4_2_ < sVar37) * auVar52._4_2_ |
                         (ushort)((short)auVar52._4_2_ >= sVar37) * sVar37;
                    sVar37 = auVar46._6_2_;
                    auVar44._6_2_ =
                         ((short)auVar52._6_2_ < sVar37) * auVar52._6_2_ |
                         (ushort)((short)auVar52._6_2_ >= sVar37) * sVar37;
                    sVar37 = auVar46._8_2_;
                    auVar44._8_2_ =
                         ((short)auVar52._8_2_ < sVar37) * auVar52._8_2_ |
                         (ushort)((short)auVar52._8_2_ >= sVar37) * sVar37;
                    sVar37 = auVar46._10_2_;
                    auVar44._10_2_ =
                         ((short)auVar52._10_2_ < sVar37) * auVar52._10_2_ |
                         (ushort)((short)auVar52._10_2_ >= sVar37) * sVar37;
                    sVar37 = auVar46._12_2_;
                    sVar42 = auVar46._14_2_;
                    auVar44._12_2_ =
                         ((short)auVar52._12_2_ < sVar37) * auVar52._12_2_ |
                         (ushort)((short)auVar52._12_2_ >= sVar37) * sVar37;
                    auVar44._14_2_ =
                         ((short)auVar52._14_2_ < sVar42) * auVar52._14_2_ |
                         (ushort)((short)auVar52._14_2_ >= sVar42) * sVar42;
                    sVar37 = auVar53._0_2_;
                    auVar51._0_2_ =
                         (sVar37 < (short)auVar52._0_2_) * auVar52._0_2_ |
                         (ushort)(sVar37 >= (short)auVar52._0_2_) * sVar37;
                    sVar37 = auVar53._2_2_;
                    auVar51._2_2_ =
                         (sVar37 < (short)auVar52._2_2_) * auVar52._2_2_ |
                         (ushort)(sVar37 >= (short)auVar52._2_2_) * sVar37;
                    sVar37 = auVar53._4_2_;
                    auVar51._4_2_ =
                         (sVar37 < (short)auVar52._4_2_) * auVar52._4_2_ |
                         (ushort)(sVar37 >= (short)auVar52._4_2_) * sVar37;
                    sVar37 = auVar53._6_2_;
                    auVar51._6_2_ =
                         (sVar37 < (short)auVar52._6_2_) * auVar52._6_2_ |
                         (ushort)(sVar37 >= (short)auVar52._6_2_) * sVar37;
                    sVar37 = auVar53._8_2_;
                    auVar51._8_2_ =
                         (sVar37 < (short)auVar52._8_2_) * auVar52._8_2_ |
                         (ushort)(sVar37 >= (short)auVar52._8_2_) * sVar37;
                    sVar37 = auVar53._10_2_;
                    auVar51._10_2_ =
                         (sVar37 < (short)auVar52._10_2_) * auVar52._10_2_ |
                         (ushort)(sVar37 >= (short)auVar52._10_2_) * sVar37;
                    sVar37 = auVar53._12_2_;
                    sVar42 = auVar53._14_2_;
                    auVar51._12_2_ =
                         (sVar37 < (short)auVar52._12_2_) * auVar52._12_2_ |
                         (ushort)(sVar37 >= (short)auVar52._12_2_) * sVar37;
                    auVar51._14_2_ =
                         (sVar42 < (short)auVar52._14_2_) * auVar52._14_2_ |
                         (ushort)(sVar42 >= (short)auVar52._14_2_) * sVar42;
                    auVar53 = psubsw(auVar52,auVar45);
                    auVar12._4_4_ = uVar38;
                    auVar12._0_4_ = uVar38;
                    auVar12._8_4_ = uVar38;
                    auVar12._12_4_ = uVar38;
                    auVar49 = psubsw(auVar49,auVar12);
                    auVar54._0_2_ = -(ushort)(auVar53._0_2_ < auVar49._0_2_);
                    auVar54._2_2_ = -(ushort)(auVar53._2_2_ < auVar49._2_2_);
                    auVar54._4_2_ = -(ushort)(auVar53._4_2_ < auVar49._4_2_);
                    auVar54._6_2_ = -(ushort)(auVar53._6_2_ < auVar49._6_2_);
                    auVar54._8_2_ = -(ushort)(auVar53._8_2_ < auVar49._8_2_);
                    auVar54._10_2_ = -(ushort)(auVar53._10_2_ < auVar49._10_2_);
                    auVar54._12_2_ = -(ushort)(auVar53._12_2_ < auVar49._12_2_);
                    auVar54._14_2_ = -(ushort)(auVar53._14_2_ < auVar49._14_2_);
                    if ((((((((((((((((auVar54 >> 7 & (undefined1  [16])0x1) ==
                                      (undefined1  [16])0x0 &&
                                     (auVar54 >> 0xf & (undefined1  [16])0x1) ==
                                     (undefined1  [16])0x0) &&
                                    (auVar54 >> 0x17 & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                                   (auVar54 >> 0x1f & (undefined1  [16])0x1) ==
                                   (undefined1  [16])0x0) &&
                                  (auVar54 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0
                                  ) && (auVar54 >> 0x2f & (undefined1  [16])0x1) ==
                                       (undefined1  [16])0x0) &&
                                (auVar54 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                               && (auVar54 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0
                               ) && (auVar54 >> 0x47 & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                             (auVar54 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar54 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar54 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar54 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar54 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar54._14_2_ >> 7 & 1) == 0) && (auVar54._14_2_ & 0x8000) == 0) break;
                    bVar36 = uVar29 < uVar35;
                    lVar27 = lVar27 + 0x10;
                    uVar29 = uVar29 + 1;
                    auVar53 = auVar51;
                    auVar46 = auVar44;
                  } while (lVar25 != lVar27);
                } while ((!bVar36) && (bVar36 = uVar31 < 7, uVar31 = uVar31 + 1, bVar36));
                uVar29 = ptr[(uint)(iVar15 % iVar34)][0];
                uVar50 = ptr[(uint)(iVar15 % iVar34)][1];
                iVar23 = iVar21;
                if (iVar16 < 7) {
                  do {
                    uVar50 = uVar50 << 0x10 | uVar29 >> 0x30;
                    iVar23 = iVar23 + -1;
                    uVar29 = uVar29 << 0x10;
                  } while (iVar23 != 0);
                }
                ((ppVar17->field_4).rowcols)->score_row[uVar26] = (int)(short)(uVar50 >> 0x30);
                uVar26 = uVar26 + 1;
                palVar18 = ptr_02;
                if (uVar26 == uVar28) {
                  uVar28 = 0;
                  do {
                    psVar2 = (short *)((long)*ptr + uVar28 * 4);
                    sVar37 = psVar2[1];
                    sVar42 = psVar2[2];
                    sVar6 = psVar2[3];
                    sVar7 = psVar2[4];
                    sVar8 = psVar2[5];
                    sVar9 = psVar2[6];
                    sVar10 = psVar2[7];
                    piVar5 = ((ppVar17->field_4).rowcols)->score_col;
                    *(int *)((long)piVar5 + uVar28) = (int)*psVar2;
                    *(int *)((long)piVar5 + (uint)(iVar34 * 4) + uVar28) = (int)sVar37;
                    *(int *)((long)piVar5 + uVar35 * 8 + uVar28) = (int)sVar42;
                    *(int *)((long)piVar5 + (ulong)(uint)(iVar34 * 4) * 3 + uVar28) = (int)sVar6;
                    *(int *)((long)piVar5 + uVar35 * 0x10 + uVar28) = (int)sVar7;
                    *(int *)((long)piVar5 + (ulong)(uint)(iVar34 * 4) * 5 + uVar28) = (int)sVar8;
                    *(int *)((long)piVar5 + uVar35 * 0x18 + uVar28) = (int)sVar9;
                    *(int *)((long)piVar5 + uVar35 * 0x1c + uVar28) = (int)sVar10;
                    uVar28 = uVar28 + 4;
                  } while ((iVar34 + (uint)(iVar34 == 0)) * 4 != uVar28);
                  uVar35 = ptr[(uint)(iVar15 % iVar34)][0];
                  uVar28 = ptr[(uint)(iVar15 % iVar34)][1];
                  if (iVar16 < 7) {
                    iVar21 = 1;
                    if (1 < iVar20) {
                      iVar21 = iVar20;
                    }
                    do {
                      uVar28 = uVar28 << 0x10 | uVar35 >> 0x30;
                      iVar21 = iVar21 + -1;
                      uVar35 = uVar35 << 0x10;
                    } while (iVar21 != 0);
                  }
                  sVar37 = auVar39._0_2_;
                  auVar41._0_2_ = -(ushort)((short)auVar44._0_2_ < sVar37);
                  sVar42 = auVar39._2_2_;
                  auVar41._2_2_ = -(ushort)((short)auVar44._2_2_ < sVar42);
                  auVar41._4_2_ = -(ushort)((short)auVar44._4_2_ < sVar37);
                  auVar41._6_2_ = -(ushort)((short)auVar44._6_2_ < sVar42);
                  auVar41._8_2_ = -(ushort)((short)auVar44._8_2_ < sVar37);
                  auVar41._10_2_ = -(ushort)((short)auVar44._10_2_ < sVar42);
                  auVar41._12_2_ = -(ushort)((short)auVar44._12_2_ < sVar37);
                  auVar41._14_2_ = -(ushort)((short)auVar44._14_2_ < sVar42);
                  sVar37 = auVar43._0_2_;
                  auVar39._0_2_ = -(ushort)(sVar37 < (short)auVar51._0_2_);
                  sVar42 = auVar43._2_2_;
                  auVar39._2_2_ = -(ushort)(sVar42 < (short)auVar51._2_2_);
                  auVar39._4_2_ = -(ushort)(sVar37 < (short)auVar51._4_2_);
                  auVar39._6_2_ = -(ushort)(sVar42 < (short)auVar51._6_2_);
                  auVar39._8_2_ = -(ushort)(sVar37 < (short)auVar51._8_2_);
                  auVar39._10_2_ = -(ushort)(sVar42 < (short)auVar51._10_2_);
                  auVar39._12_2_ = -(ushort)(sVar37 < (short)auVar51._12_2_);
                  auVar39._14_2_ = -(ushort)(sVar42 < (short)auVar51._14_2_);
                  auVar39 = auVar39 | auVar41;
                  if ((((((((((((((((auVar39 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0
                                   && (auVar39 >> 0xf & (undefined1  [16])0x1) ==
                                      (undefined1  [16])0x0) &&
                                  (auVar39 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0
                                  ) && (auVar39 >> 0x1f & (undefined1  [16])0x1) ==
                                       (undefined1  [16])0x0) &&
                                (auVar39 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                               && (auVar39 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0
                               ) && (auVar39 >> 0x37 & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                             (auVar39 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar39 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar39 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar39 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar39 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar39 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar39 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar39 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      -1 < auVar39[0xf]) {
                    sVar37 = (short)(uVar28 >> 0x30);
                  }
                  else {
                    *(byte *)&ppVar17->flag = (byte)ppVar17->flag | 0x40;
                    sVar37 = 0;
                    iVar19 = 0;
                    iVar15 = 0;
                  }
                  ppVar17->score = (int)sVar37;
                  ppVar17->end_query = iVar15;
                  ppVar17->end_ref = iVar19;
                  parasail_free(ptr_01);
                  parasail_free(ptr_00);
                  parasail_free(ptr_02);
                  parasail_free(ptr);
                  return ppVar17;
                }
              } while( true );
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict vProfile = NULL;
    __m128i* restrict pvHStore = NULL;
    __m128i* restrict pvHLoad = NULL;
    __m128i* restrict pvE = NULL;
    int16_t* restrict boundary = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    int16_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile16.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 8; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    vProfile = (__m128i*)profile->profile16.score;
    vGapO = _mm_set1_epi16(open);
    vGapE = _mm_set1_epi16(gap);
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_8;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore = parasail_memalign___m128i(16, segLen);
    pvHLoad  = parasail_memalign___m128i(16, segLen);
    pvE      = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int16_t(16, s2Len+1);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvE) return NULL;
    if (!boundary) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_16_t h;
            __m128i_16_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = -open-gap*(segNum*segLen+i);
                h.v[segNum] = tmp < INT16_MIN ? INT16_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT16_MIN ? INT16_MIN : tmp;
            }
            _mm_store_si128(&pvHStore[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = -open-gap*(i-1);
            boundary[i] = tmp < INT16_MIN ? INT16_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        /* Initialize F value to -inf.  Any errors to vH values will be
         * corrected in the Lazy_F loop.  */
        __m128i vF = vNegLimit;

        /* load final segment of pvHStore and shift left by 2 bytes */
        __m128i vH = _mm_slli_si128(pvHStore[segLen - 1], 2);

        /* Correct part of the vProfile */
        const __m128i* vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        /* Swap the 2 H buffers. */
        __m128i* pv = pvHLoad;
        pvHLoad = pvHStore;
        pvHStore = pv;

        /* insert upper boundary condition */
        vH = _mm_insert_epi16(vH, boundary[j], 0);

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vH = _mm_adds_epi16(vH, _mm_load_si128(vP + i));
            vE = _mm_load_si128(pvE + i);

            /* Get max from vH, vE and vF. */
            vH = _mm_max_epi16(vH, vE);
            vH = _mm_max_epi16(vH, vF);
            /* Save vH values. */
            _mm_store_si128(pvHStore + i, vH);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vH);
            vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vH);
            vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vE);
            vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vF);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif

            /* Update vE value. */
            vH = _mm_subs_epi16(vH, vGapO);
            vE = _mm_subs_epi16(vE, vGapE);
            vE = _mm_max_epi16(vE, vH);
            _mm_store_si128(pvE + i, vE);

            /* Update vF value. */
            vF = _mm_subs_epi16(vF, vGapE);
            vF = _mm_max_epi16(vF, vH);

            /* Load the next vH. */
            vH = _mm_load_si128(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            int64_t tmp = boundary[j+1]-open;
            int16_t tmp2 = tmp < INT16_MIN ? INT16_MIN : tmp;
            vF = _mm_slli_si128(vF, 2);
            vF = _mm_insert_epi16(vF, tmp2, 0);
            for (i=0; i<segLen; ++i) {
                vH = _mm_load_si128(pvHStore + i);
                vH = _mm_max_epi16(vH,vF);
                _mm_store_si128(pvHStore + i, vH);
                vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vH);
                vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
                arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                vH = _mm_subs_epi16(vH, vGapO);
                vF = _mm_subs_epi16(vF, vGapE);
                if (! _mm_movemask_epi8(_mm_cmpgt_epi16(vF, vH))) goto end;
                /*vF = _mm_max_epi16(vF, vH);*/
            }
        }
end:
        {
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm_load_si128(pvHStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 2);
            }
            result->rowcols->score_row[j] = (int16_t) _mm_extract_epi16 (vH, 7);
        }
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvHStore+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* extract last value from the last column */
    {
        __m128i vH = _mm_load_si128(pvHStore + offset);
        for (k=0; k<position; ++k) {
            vH = _mm_slli_si128 (vH, 2);
        }
        score = (int16_t) _mm_extract_epi16 (vH, 7);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi16(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(boundary);
    parasail_free(pvE);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}